

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::init
          (MultisampleRenderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int *piVar2;
  deUint32 *pdVar3;
  ostringstream *poVar4;
  RenderContext *pRVar5;
  bool bVar6;
  int iVar7;
  ContextType ctxType;
  deUint32 dVar8;
  RenderTarget RVar9;
  uint uVar10;
  int extraout_EAX;
  undefined4 extraout_var;
  mapped_type *pmVar12;
  NotSupportedError *pNVar13;
  MessageBuilder *pMVar14;
  ShaderProgram *pSVar15;
  ProgramSources *pPVar16;
  RenderTarget *pRVar17;
  TestLog *pTVar18;
  TestError *pTVar19;
  size_t __n;
  deInt32 *pdVar20;
  void *__buf;
  void *__buf_00;
  undefined4 uVar21;
  uint uVar22;
  deInt32 queriedSampleCount;
  allocator<char> local_2b1;
  deInt32 maxRboSamples;
  string local_2a8 [32];
  undefined1 local_288 [40];
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [184];
  undefined1 uStack_148;
  undefined7 uStack_147;
  undefined1 uStack_140;
  undefined8 uStack_13f;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  long lVar11;
  
  pdVar20 = &queriedSampleCount;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  queriedSampleCount = -1;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar6 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_200,"GLSL_VERSION_DECL",(allocator<char> *)&maxRboSamples);
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&args,(key_type *)local_200);
  std::__cxx11::string::assign((char *)pmVar12);
  std::__cxx11::string::~string((string *)local_200);
  RVar9 = this->m_renderTarget;
  if (RVar9 == TARGET_DEFAULT) {
    pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
    piVar2 = &this->m_renderSize;
    if ((pRVar17->m_width < this->m_renderSize) ||
       (pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context),
       pRVar17->m_height < *piVar2)) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_260,piVar2);
      std::operator+(&local_240,"Test requires render target with size ",&local_260);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     &local_240,"x");
      de::toString<int>(&local_220,piVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &maxRboSamples,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                     &local_220);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &maxRboSamples," or greater");
      tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)local_200);
      __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (RVar9 == TARGET_TEXTURE) {
    maxRboSamples = 0;
    (**(code **)(lVar11 + 0x880))(0x9100,0x8058,0x80a9,1);
    if (maxRboSamples < this->m_numRequestedSamples) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Sample count not supported",(allocator<char> *)local_288);
      tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)local_200);
      __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (RVar9 == TARGET_RENDERBUFFER) {
    maxRboSamples = 0;
    (**(code **)(lVar11 + 0x880))(0x8d41,0x8058,0x80a9,1);
    if (maxRboSamples < this->m_numRequestedSamples) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Sample count not supported",(allocator<char> *)local_288);
      tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)local_200);
      __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_buffer);
  dVar8 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar8,"gen buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x91);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xe])(this);
  dVar8 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar8,"setup data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x94);
  (**(code **)(lVar11 + 0x708))(1,&this->m_renderVao);
  dVar8 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar8,"gen vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0x97);
  if ((init()::fullscreenQuad == '\0') &&
     (iVar7 = __cxa_guard_acquire(&init()::fullscreenQuad), iVar7 != 0)) {
    init::fullscreenQuad[0].m_data[0] = _DAT_007f37b0;
    init::fullscreenQuad[0].m_data[1] = _UNK_007f37b4;
    init::fullscreenQuad[0].m_data[2] = _UNK_007f37b8;
    init::fullscreenQuad[0].m_data[3] = _UNK_007f37bc;
    init::fullscreenQuad[1].m_data[0] = _DAT_007f08c0;
    init::fullscreenQuad[1].m_data[1] = _UNK_007f08c4;
    init::fullscreenQuad[1].m_data[2] = _UNK_007f08c8;
    init::fullscreenQuad[1].m_data[3] = _UNK_007f08cc;
    init::fullscreenQuad[2].m_data[0] = _DAT_007f3790;
    init::fullscreenQuad[2].m_data[1] = _UNK_007f3794;
    init::fullscreenQuad[2].m_data[2] = _UNK_007f3798;
    init::fullscreenQuad[2].m_data[3] = _UNK_007f379c;
    init::fullscreenQuad[3].m_data[0] = _DAT_007f37a0;
    init::fullscreenQuad[3].m_data[1] = _UNK_007f37a4;
    init::fullscreenQuad[3].m_data[2] = _UNK_007f37a8;
    init::fullscreenQuad[3].m_data[3] = _UNK_007f37ac;
    __cxa_guard_release(&init()::fullscreenQuad);
  }
  (**(code **)(lVar11 + 0x6c8))(1,&this->m_resolveBuffer);
  (**(code **)(lVar11 + 0x40))(0x8892,this->m_resolveBuffer);
  (**(code **)(lVar11 + 0x150))(0x8892,0x40,init::fullscreenQuad,0x88e4);
  dVar8 = (**(code **)(lVar11 + 0x800))();
  __n = 0xa6;
  glu::checkError(dVar8,"setup data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                  ,0xa6);
  RVar9 = this->m_renderTarget;
  if (RVar9 == TARGET_RENDERBUFFER) {
    pdVar3 = &this->m_fboRbo;
    (**(code **)(lVar11 + 0x6e8))(1,pdVar3);
    (**(code **)(lVar11 + 0xa0))(0x8d41,*pdVar3);
    (**(code **)(lVar11 + 0x1240))
              (0x8d41,this->m_numRequestedSamples,0x8058,this->m_renderSize,this->m_renderSize);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"gen rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xe3);
    (**(code **)(lVar11 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar11 + 0x78))(0x8d40,this->m_fbo);
    (**(code **)(lVar11 + 0x688))(0x8d40,0x8ce0,0x8d41,*pdVar3);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    __n = 0xe8;
    glu::checkError(dVar8,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xe8);
    iVar7 = (**(code **)(lVar11 + 0x170))(0x8d40);
    if (iVar7 != 0x8cd5) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"fbo not complete",(allocator<char> *)&maxRboSamples);
      tcu::TestError::TestError(pTVar19,(string *)local_200);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar11 + 0xa30))(0x8d41,0x8cab,&queriedSampleCount);
    local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar4 = (ostringstream *)(local_200 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::operator<<((ostream *)poVar4,"Asked for ");
    pMVar14 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_200,&this->m_numRequestedSamples);
    poVar1 = &pMVar14->m_str;
    std::operator<<((ostream *)poVar1," samples, got ");
    std::ostream::operator<<(poVar1,queriedSampleCount);
    std::operator<<((ostream *)poVar1," samples.");
    tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    if (queriedSampleCount < this->m_numRequestedSamples) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Got less renderbuffer samples samples than asked for",
                 (allocator<char> *)&maxRboSamples);
      tcu::TestError::TestError(pTVar19,(string *)local_200);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
LAB_004de65f:
    RVar9 = this->m_renderTarget;
  }
  else if (RVar9 == TARGET_TEXTURE) {
    uVar21 = 0x9100;
    if (this->m_numRequestedSamples == 0) {
      uVar21 = 0xde1;
    }
    (**(code **)(lVar11 + 0x708))(1,&this->m_resolveVao);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"gen vao",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xb1);
    pdVar3 = &this->m_fboTexture;
    (**(code **)(lVar11 + 0x6f8))(1,pdVar3);
    (**(code **)(lVar11 + 0xb8))(uVar21,*pdVar3);
    iVar7 = this->m_renderSize;
    if (this->m_numRequestedSamples == 0) {
      (**(code **)(lVar11 + 0x1380))(uVar21,1,0x8058,iVar7,iVar7);
      (**(code **)(lVar11 + 0x1360))(uVar21,0x2800,0x2600);
      (**(code **)(lVar11 + 0x1360))(uVar21,0x2801,0x2600);
    }
    else {
      (**(code **)(lVar11 + 0x1390))(uVar21,this->m_numRequestedSamples,0x8058,iVar7,iVar7,0);
    }
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"gen tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xbd);
    (**(code **)(lVar11 + 0x6d0))(1,&this->m_fbo);
    (**(code **)(lVar11 + 0x78))(0x8d40,this->m_fbo);
    (**(code **)(lVar11 + 0x6a0))(0x8d40,0x8ce0,uVar21,*pdVar3,0);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    __n = 0xc2;
    glu::checkError(dVar8,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xc2);
    iVar7 = (**(code **)(lVar11 + 0x170))(0x8d40);
    if (iVar7 != 0x8cd5) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"fbo not complete",(allocator<char> *)&maxRboSamples);
      tcu::TestError::TestError(pTVar19,(string *)local_200);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    piVar2 = &this->m_numRequestedSamples;
    if (*piVar2 != 0) {
      (**(code **)(lVar11 + 0xab0))(0x9100,0,0x9106);
      local_200._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar4 = (ostringstream *)(local_200 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::operator<<((ostream *)poVar4,"Asked for ");
      pMVar14 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_200,piVar2);
      poVar1 = &pMVar14->m_str;
      std::operator<<((ostream *)poVar1," samples, got ");
      std::ostream::operator<<(poVar1,queriedSampleCount);
      std::operator<<((ostream *)poVar1," samples.");
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      __n = (size_t)pdVar20;
      if (queriedSampleCount < *piVar2) {
        pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,"Got less texture samples than asked for",
                   (allocator<char> *)&maxRboSamples);
        tcu::TestError::TestError(pTVar19,(string *)local_200);
        __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    pSVar15 = (ShaderProgram *)operator_new(0xd0);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(local_200,0,0xac);
    local_200._176_8_ = (pointer)0x0;
    uStack_148 = 0;
    uStack_147 = 0;
    uStack_140 = 0;
    uStack_13f = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}"
               ,&local_2b1);
    tcu::StringTemplate::StringTemplate((StringTemplate *)&local_260,&local_220);
    tcu::StringTemplate::specialize(&local_240,(StringTemplate *)&local_260,&args);
    glu::VertexSource::VertexSource((VertexSource *)&maxRboSamples,&local_240);
    pPVar16 = glu::ProgramSources::operator<<
                        ((ProgramSources *)local_200,(ShaderSource *)&maxRboSamples);
    genMSSamplerSource_abi_cxx11_(&local_80,this,queriedSampleCount);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_288,&local_80);
    pPVar16 = glu::ProgramSources::operator<<(pPVar16,(ShaderSource *)local_288);
    glu::ShaderProgram::ShaderProgram(pSVar15,pRVar5,pPVar16);
    this->m_textureSamplerProgram = pSVar15;
    std::__cxx11::string::~string((string *)(local_288 + 8));
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string((string *)&local_240);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_260);
    std::__cxx11::string::~string((string *)&local_220);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_200);
    if ((this->m_textureSamplerProgram->m_program).m_info.linkOk == false) {
      pTVar18 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&maxRboSamples,"SamplerShader",(allocator<char> *)&local_240);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_288,"Sampler shader",(allocator<char> *)&local_260);
      tcu::LogSection::LogSection
                ((LogSection *)local_200,(string *)&maxRboSamples,(string *)local_288);
      tcu::LogSection::write((LogSection *)local_200,(int)pTVar18,__buf_00,__n);
      pTVar18 = glu::operator<<(pTVar18,this->m_textureSamplerProgram);
      tcu::TestLog::endSection(pTVar18);
      tcu::LogSection::~LogSection((LogSection *)local_200);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)&maxRboSamples);
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"could not build program",(allocator<char> *)&maxRboSamples);
      tcu::TestError::TestError(pTVar19,(string *)local_200);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    goto LAB_004de65f;
  }
  if (RVar9 == TARGET_DEFAULT) {
LAB_004de792:
    pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
    uVar10 = pRVar17->m_numSamples;
  }
  else {
    pdVar3 = &this->m_resolveFboTexture;
    (**(code **)(lVar11 + 0x6f8))(1,pdVar3);
    (**(code **)(lVar11 + 0xb8))(0xde1,*pdVar3);
    (**(code **)(lVar11 + 0x1380))(0xde1,1,0x8058,this->m_renderSize,this->m_renderSize);
    (**(code **)(lVar11 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar11 + 0x1360))(0xde1,0x2801,0x2600);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    glu::checkError(dVar8,"gen tex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0xfe);
    (**(code **)(lVar11 + 0x6d0))(1,&this->m_resolveFbo);
    (**(code **)(lVar11 + 0x78))(0x8d40,this->m_resolveFbo);
    (**(code **)(lVar11 + 0x6a0))(0x8d40,0x8ce0,0xde1,*pdVar3,0);
    dVar8 = (**(code **)(lVar11 + 0x800))();
    __n = 0x103;
    glu::checkError(dVar8,"gen fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleShaderRenderCase.cpp"
                    ,0x103);
    iVar7 = (**(code **)(lVar11 + 0x170))(0x8d40);
    if (iVar7 != 0x8cd5) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"resolve fbo not complete",(allocator<char> *)&maxRboSamples);
      tcu::TestError::TestError(pTVar19,(string *)local_200);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    RVar9 = this->m_renderTarget;
    if (RVar9 == TARGET_DEFAULT) goto LAB_004de792;
    uVar10 = queriedSampleCount;
    if (RVar9 != TARGET_RENDERBUFFER) {
      if (RVar9 != TARGET_TEXTURE) {
        uVar22 = 0xffffffff;
        goto LAB_004de7a9;
      }
      uVar22 = 1;
      if (this->m_numRequestedSamples == 0) goto LAB_004de7a9;
    }
  }
  uVar22 = 1;
  if (1 < (int)uVar10) {
    uVar22 = uVar10;
  }
LAB_004de7a9:
  this->m_numTargetSamples = uVar22;
  if (this->m_perIterationShader == false) {
    pSVar15 = (ShaderProgram *)operator_new(0xd0);
    pRVar5 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(local_200,0,0xac);
    local_200._176_8_ = (pointer)0x0;
    uStack_148 = 0;
    uStack_147 = 0;
    uStack_140 = 0;
    uStack_13f = 0;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
              (&local_240,this,(ulong)uVar22);
    glu::VertexSource::VertexSource((VertexSource *)&maxRboSamples,&local_240);
    pPVar16 = glu::ProgramSources::operator<<
                        ((ProgramSources *)local_200,(ShaderSource *)&maxRboSamples);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
              (&local_260,this,(ulong)(uint)this->m_numTargetSamples);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_288,&local_260);
    pPVar16 = glu::ProgramSources::operator<<(pPVar16,(ShaderSource *)local_288);
    glu::ShaderProgram::ShaderProgram(pSVar15,pRVar5,pPVar16);
    this->m_program = pSVar15;
    std::__cxx11::string::~string((string *)(local_288 + 8));
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string((string *)&local_240);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_200);
    pTVar18 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxRboSamples,"RenderShader",(allocator<char> *)&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_288,"Render shader",(allocator<char> *)&local_260);
    tcu::LogSection::LogSection
              ((LogSection *)local_200,(string *)&maxRboSamples,(string *)local_288);
    tcu::LogSection::write((LogSection *)local_200,(int)pTVar18,__buf,__n);
    pTVar18 = glu::operator<<(pTVar18,this->m_program);
    tcu::TestLog::endSection(pTVar18);
    tcu::LogSection::~LogSection((LogSection *)local_200);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)&maxRboSamples);
    if ((this->m_program->m_program).m_info.linkOk == false) {
      pTVar19 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"could not build program",(allocator<char> *)&maxRboSamples);
      tcu::TestError::TestError(pTVar19,(string *)local_200);
      __cxa_throw(pTVar19,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  return extraout_EAX;
}

Assistant:

void MultisampleRenderCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	deInt32					queriedSampleCount	= -1;
	const bool				supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>		args;

	args["GLSL_VERSION_DECL"] = supportsES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	// requirements

	switch (m_renderTarget)
	{
		case TARGET_DEFAULT:
		{
			if (m_context.getRenderTarget().getWidth() < m_renderSize || m_context.getRenderTarget().getHeight() < m_renderSize)
				throw tcu::NotSupportedError("Test requires render target with size " + de::toString(m_renderSize) + "x" + de::toString(m_renderSize) + " or greater");
			break;
		}

		case TARGET_TEXTURE:
		{
			deInt32 maxTextureSamples = 0;
			gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, GL_RGBA8, GL_SAMPLES, 1, &maxTextureSamples);

			if (m_numRequestedSamples > maxTextureSamples)
				throw tcu::NotSupportedError("Sample count not supported");
			break;
		}

		case TARGET_RENDERBUFFER:
		{
			deInt32 maxRboSamples = 0;
			gl.getInternalformativ(GL_RENDERBUFFER, GL_RGBA8, GL_SAMPLES, 1, &maxRboSamples);

			if (m_numRequestedSamples > maxRboSamples)
				throw tcu::NotSupportedError("Sample count not supported");
			break;
		}

		default:
			DE_ASSERT(false);
	}

	// resources

	{
		gl.genBuffers(1, &m_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buf");

		setupRenderData();
		GLU_EXPECT_NO_ERROR(gl.getError(), "setup data");

		gl.genVertexArrays(1, &m_renderVao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen vao");

		// buffer for MSAA texture resolving
		{
			static const tcu::Vec4 fullscreenQuad[] =
			{
				tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
				tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
				tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
				tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			};

			gl.genBuffers(1, &m_resolveBuffer);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_resolveBuffer);
			gl.bufferData(GL_ARRAY_BUFFER, (int)sizeof(fullscreenQuad), fullscreenQuad, GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup data");
		}
	}

	// msaa targets

	if (m_renderTarget == TARGET_TEXTURE)
	{
		const deUint32 textureTarget = (m_numRequestedSamples == 0) ? (GL_TEXTURE_2D) : (GL_TEXTURE_2D_MULTISAMPLE);

		gl.genVertexArrays(1, &m_resolveVao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen vao");

		gl.genTextures(1, &m_fboTexture);
		gl.bindTexture(textureTarget, m_fboTexture);
		if (m_numRequestedSamples == 0)
		{
			gl.texStorage2D(textureTarget, 1, GL_RGBA8, m_renderSize, m_renderSize);
			gl.texParameteri(textureTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(textureTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
		else
			gl.texStorage2DMultisample(textureTarget, m_numRequestedSamples, GL_RGBA8, m_renderSize, m_renderSize, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, textureTarget, m_fboTexture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("fbo not complete");

		if (m_numRequestedSamples != 0)
		{
			// for shader
			gl.getTexLevelParameteriv(GL_TEXTURE_2D_MULTISAMPLE, 0, GL_TEXTURE_SAMPLES, &queriedSampleCount);

			// logging
			m_testCtx.getLog() << tcu::TestLog::Message << "Asked for " << m_numRequestedSamples << " samples, got " << queriedSampleCount << " samples." << tcu::TestLog::EndMessage;

			// sanity
			if (queriedSampleCount < m_numRequestedSamples)
				throw tcu::TestError("Got less texture samples than asked for");
		}

		// texture sampler shader
		m_textureSamplerProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(tcu::StringTemplate(s_vertexSource).specialize(args))
			<< glu::FragmentSource(genMSSamplerSource(queriedSampleCount)));
		if (!m_textureSamplerProgram->isOk())
		{
			m_testCtx.getLog() << tcu::TestLog::Section("SamplerShader", "Sampler shader") << *m_textureSamplerProgram << tcu::TestLog::EndSection;
			throw tcu::TestError("could not build program");
		}
	}
	else if (m_renderTarget == TARGET_RENDERBUFFER)
	{
		gl.genRenderbuffers(1, &m_fboRbo);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_fboRbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numRequestedSamples, GL_RGBA8, m_renderSize, m_renderSize);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen rbo");

		gl.genFramebuffers(1, &m_fbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_fboRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("fbo not complete");

		// logging
		gl.getRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_SAMPLES, &queriedSampleCount);
		m_testCtx.getLog() << tcu::TestLog::Message << "Asked for " << m_numRequestedSamples << " samples, got " << queriedSampleCount << " samples." << tcu::TestLog::EndMessage;

		// sanity
		if (queriedSampleCount < m_numRequestedSamples)
			throw tcu::TestError("Got less renderbuffer samples samples than asked for");
	}

	// fbo for resolving the multisample fbo
	if (m_renderTarget != TARGET_DEFAULT)
	{
		gl.genTextures(1, &m_resolveFboTexture);
		gl.bindTexture(GL_TEXTURE_2D, m_resolveFboTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, m_renderSize, m_renderSize);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen tex");

		gl.genFramebuffers(1, &m_resolveFbo);
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_resolveFbo);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_resolveFboTexture, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

		if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			throw tcu::TestError("resolve fbo not complete");
	}

	// create verifier shader and set targetSampleCount

	{
		int realSampleCount = -1;

		if (m_renderTarget == TARGET_TEXTURE)
		{
			if (m_numRequestedSamples == 0)
				realSampleCount = 1; // non msaa texture
			else
				realSampleCount = de::max(1, queriedSampleCount); // msaa texture
		}
		else if (m_renderTarget == TARGET_RENDERBUFFER)
		{
			realSampleCount = de::max(1, queriedSampleCount); // msaa rbo
		}
		else if (m_renderTarget == TARGET_DEFAULT)
		{
			realSampleCount = de::max(1, m_context.getRenderTarget().getNumSamples());
		}
		else
			DE_ASSERT(DE_FALSE);

		// is set and is valid
		DE_ASSERT(realSampleCount != -1);
		DE_ASSERT(realSampleCount != 0);
		m_numTargetSamples = realSampleCount;
	}

	if (!m_perIterationShader)
	{
		m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource(m_numTargetSamples)) << glu::FragmentSource(genFragmentSource(m_numTargetSamples)));
		m_testCtx.getLog() << tcu::TestLog::Section("RenderShader", "Render shader") << *m_program << tcu::TestLog::EndSection;
		if (!m_program->isOk())
			throw tcu::TestError("could not build program");

	}
}